

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_rel_prop
                   (string *__return_storage_ptr__,Property *prop,string *name,uint32_t indent)

{
  bool bVar1;
  ListEditQual LVar2;
  ostream *poVar3;
  uint32_t n;
  ListEditQual v;
  string local_220;
  Relationship *local_200;
  Relationship *rel;
  string local_1d8;
  undefined4 local_1b4;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  Property *prop_local;
  
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)prop;
  prop_local = (Property *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = Property::is_relationship((Property *)name_local);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)local_24,n);
    ::std::operator<<(aoStack_1a0,(string *)&local_1d8);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    bVar1 = Property::has_custom((Property *)name_local);
    if (bVar1) {
      ::std::operator<<(aoStack_1a0,"custom ");
    }
    LVar2 = Property::get_listedit_qual((Property *)name_local);
    if (LVar2 != ResetToExplicit) {
      LVar2 = Property::get_listedit_qual((Property *)name_local);
      to_string_abi_cxx11_((string *)&rel,(tinyusdz *)(ulong)LVar2,v);
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)&rel);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::~string((string *)&rel);
    }
    local_200 = Property::get_relationship((Property *)name_local);
    bVar1 = Relationship::is_varying_authored(local_200);
    if (bVar1) {
      ::std::operator<<(aoStack_1a0,"varying ");
    }
    anon_unknown_173::print_rel_only(&local_220,local_200,psStack_20,local_24);
    ::std::operator<<(aoStack_1a0,(string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::stringstream::str();
  }
  else {
    ::std::__cxx11::stringstream::str();
  }
  local_1b4 = 1;
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_rel_prop(const Property &prop, const std::string &name,
                           uint32_t indent) {
  std::stringstream ss;

  if (!prop.is_relationship()) {
    return ss.str();
  }

  ss << pprint::Indent(indent);

  if (prop.has_custom()) {
    ss << "custom ";
  }

  // List editing
  if (prop.get_listedit_qual() != ListEditQual::ResetToExplicit) {
    ss << to_string(prop.get_listedit_qual()) << " ";
  }

  const Relationship &rel = prop.get_relationship();
  if (rel.is_varying_authored()) {
    ss << "varying ";
  }

  ss << print_rel_only(rel, name, indent);

  return ss.str();
}